

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,handle *args,handle *args_1,none *args_2,str *args_3)

{
  int iVar1;
  handle *this_00;
  object_api<pybind11::handle> *in_RSI;
  PyObject *in_RDI;
  simple_collector<(pybind11::return_value_policy)1> *in_R8;
  PyObject *in_R9;
  handle args_2_00;
  handle *in_stack_ffffffffffffffb8;
  
  args_2_00.m_ptr = in_RDI;
  iVar1 = PyGILState_Check();
  if (iVar1 == 0) {
    pybind11_fail((char *)in_RSI);
  }
  collect_arguments<(pybind11::return_value_policy)1,pybind11::handle,pybind11::handle,pybind11::none,pybind11::str,void>
            (in_stack_ffffffffffffffb8,(handle *)in_RSI,(none *)args_2_00.m_ptr,(str *)in_RDI);
  this_00 = derived(in_RSI);
  pybind11::handle::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call(in_R8,in_R9);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)0x1a4f20);
  return (object)(handle)args_2_00.m_ptr;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
#if !defined(NDEBUG) && PY_VERSION_HEX >= 0x03060000
    if (!PyGILState_Check()) {
        pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
    }
#endif
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}